

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

Assignment * __thiscall
soul::PoolAllocator::
allocate<soul::AST::Assignment,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::BinaryOperator&>
          (PoolAllocator *this,Context *args,pool_ref<soul::AST::Expression> *args_1,
          BinaryOperator *args_2)

{
  PoolItem *pPVar1;
  
  pPVar1 = allocateSpaceForObject(this,0x40);
  AST::Assignment::Assignment
            ((Assignment *)&pPVar1->item,args,args_1->object,&args_2->super_Expression);
  pPVar1->destructor =
       allocate<soul::AST::Assignment,_soul::AST::Context_&,_soul::pool_ref<soul::AST::Expression>_&,_soul::AST::BinaryOperator_&>
       ::anon_class_1_0_00000001::__invoke;
  return (Assignment *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }